

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

void kill_arena_monster(monster_conflict *mon)

{
  monster_conflict *mon_00;
  
  mon_00 = (monster_conflict *)cave_monster(cave,mon->midx);
  if (mon_00 != (monster_conflict *)0x0) {
    update_mon(mon_00,(chunk *)cave,true);
    mon_00->hp = -1;
    player_kill_monster(mon_00,player," is defeated!");
    return;
  }
  __assert_fail("old_mon",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-util.c"
                ,0x51f,"void kill_arena_monster(struct monster *)");
}

Assistant:

void kill_arena_monster(struct monster *mon)
{
	struct monster *old_mon = cave_monster(cave, mon->midx);
	assert(old_mon);
	update_mon(old_mon, cave, true);
	old_mon->hp = -1;
	player_kill_monster(old_mon, player, " is defeated!");
}